

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_1in_1out.c
# Opt level: O2

ErrorNumber test_func_1in_1out(TA_History *history)

{
  int startIdx;
  int endIdx;
  TA_Real *pTVar1;
  long lVar2;
  TA_TestId TVar3;
  TA_RetCode TVar4;
  TA_RetCode TVar5;
  ErrorNumber EVar6;
  int *piVar7;
  TestBuffer *pTVar8;
  ulong uVar9;
  TA_Test_conflict *pTVar10;
  TA_FuncUnstId unstId;
  ulong uVar11;
  uint integerTolerance;
  ulong uVar12;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_History *local_70;
  long local_68;
  TA_Test_conflict *local_60;
  TA_Real *local_58;
  ulong local_50;
  TA_Real *local_48;
  TestBuffer *local_40;
  TestBuffer *local_38;
  
  local_38 = (TestBuffer *)&history->close;
  local_40 = gBuffer + 1;
  uVar12 = 0;
  local_70 = history;
  do {
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if (uVar12 == 0xe) {
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < tableTest[uVar12].expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar12 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    pTVar10 = tableTest + uVar12;
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    TVar3 = tableTest[uVar12].theFunction;
    pTVar8 = local_38;
    if (TVar3 < TA_ACCBANDS_TEST) {
      TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                  gBuffer[0].in);
      TA_MEDPRICE(0,history->nbBars - 1,history->high,history->low,&outBegIdx,&outNbElement,
                  gBuffer[1].in);
      TVar3 = tableTest[uVar12].theFunction;
      pTVar8 = local_40;
    }
    local_48 = pTVar8->in;
    startIdx = tableTest[uVar12].startIdx;
    endIdx = tableTest[uVar12].endIdx;
    local_68 = (long)(endIdx - startIdx);
    local_50 = uVar12;
    switch(TVar3) {
    case TA_ANY_MA_TEST:
      TVar4 = TA_HT_DCPERIOD(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0)
      ;
      history = local_70;
      break;
    case TA_AD_TEST:
      TVar4 = TA_HT_DCPHASE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0);
      history = local_70;
      break;
    case TA_ADOSC_3_10_TEST:
      TVar4 = TA_HT_TRENDLINE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0
                             );
      history = local_70;
      break;
    case TA_ADOSC_5_2_TEST:
      piVar7 = (int *)malloc(local_68 * 4 + 0xc);
      *piVar7 = -0x54540124;
      piVar7[local_68 + 2] = -0x10543201;
      TVar5 = TA_HT_TRENDMODE(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,piVar7 + 1);
      history = local_70;
      pTVar1 = gBuffer[0].out0;
      TVar4 = 0x1412;
      if ((*piVar7 == -0x54540124) && (TVar4 = 0x1413, piVar7[local_68 + 2] == -0x10543201)) {
        uVar9 = (ulong)(uint)outNbElement;
        if (outNbElement < 1) {
          uVar9 = 0;
        }
        for (uVar11 = 0; TVar4 = TVar5, uVar9 != uVar11; uVar11 = uVar11 + 1) {
          pTVar1[uVar11] = (double)piVar7[uVar11 + 1];
        }
      }
      free(piVar7);
      break;
    case TA_ACCBANDS_TEST:
      TVar4 = TA_SIN(startIdx,endIdx,gBuffer[0].in,&outBegIdx,&outNbElement,gBuffer[0].out0);
      history = local_70;
      break;
    default:
      TVar4 = 0x140d;
      history = local_70;
    }
    EVar6 = checkDataSame(gBuffer[0].in,local_48,history->nbBars);
    if (EVar6 != TA_TEST_PASS) goto LAB_00114563;
    EVar6 = checkExpectedValue(gBuffer[0].out0,TVar4,tableTest[uVar12].expectedRetCode,outBegIdx,
                               tableTest[uVar12].expectedBegIdx,outNbElement,
                               tableTest[uVar12].expectedNbElement,
                               tableTest[uVar12].oneOfTheExpectedOutReal0,
                               tableTest[uVar12].oneOfTheExpectedOutRealIndex0);
    lVar2 = local_68;
    if (EVar6 != TA_TEST_PASS) {
LAB_00114550:
      printf("Fail for output id=%d\n",0);
      goto LAB_00114563;
    }
    outNbElement = 0;
    outBegIdx = 0;
    switch(tableTest[uVar12].theFunction) {
    case TA_ANY_MA_TEST:
      TVar4 = TA_HT_DCPERIOD(tableTest[uVar12].startIdx,tableTest[uVar12].endIdx,gBuffer[0].in,
                             &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_AD_TEST:
      TVar4 = TA_HT_DCPHASE(tableTest[uVar12].startIdx,tableTest[uVar12].endIdx,gBuffer[0].in,
                            &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar4 = TA_HT_TRENDLINE(tableTest[uVar12].startIdx,tableTest[uVar12].endIdx,gBuffer[0].in,
                              &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_5_2_TEST:
      piVar7 = (int *)malloc(local_68 * 4 + 0xc);
      *piVar7 = -0x54540124;
      piVar7[lVar2 + 2] = -0x10543201;
      TVar5 = TA_HT_TRENDMODE(tableTest[uVar12].startIdx,tableTest[uVar12].endIdx,gBuffer[0].in,
                              &outBegIdx,&outNbElement,piVar7 + 1);
      pTVar1 = gBuffer[0].in;
      TVar4 = 0x1412;
      if ((*piVar7 == -0x54540124) && (TVar4 = 0x1413, piVar7[lVar2 + 2] == -0x10543201)) {
        uVar9 = (ulong)(uint)outNbElement;
        if (outNbElement < 1) {
          uVar9 = 0;
        }
        for (uVar11 = 0; TVar4 = TVar5, uVar9 != uVar11; uVar11 = uVar11 + 1) {
          pTVar1[uVar11] = (double)piVar7[uVar11 + 1];
        }
      }
      free(piVar7);
      break;
    case TA_ACCBANDS_TEST:
      TVar4 = TA_SIN(tableTest[uVar12].startIdx,tableTest[uVar12].endIdx,gBuffer[0].in,&outBegIdx,
                     &outNbElement,gBuffer[0].in);
      break;
    default:
      TVar4 = 0x140e;
    }
    EVar6 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
    if (EVar6 != TA_TEST_PASS) goto LAB_00114563;
    EVar6 = checkExpectedValue(gBuffer[0].in,TVar4,tableTest[uVar12].expectedRetCode,outBegIdx,
                               tableTest[uVar12].expectedBegIdx,outNbElement,
                               tableTest[uVar12].expectedNbElement,
                               tableTest[uVar12].oneOfTheExpectedOutReal0,
                               tableTest[uVar12].oneOfTheExpectedOutRealIndex0);
    if (EVar6 != TA_TEST_PASS) goto LAB_00114550;
    local_58 = local_48;
    local_60 = pTVar10;
    if (pTVar10->doRangeTestFlag != 0) {
      switch(tableTest[uVar12].theFunction) {
      case TA_ANY_MA_TEST:
        unstId = TA_FUNC_UNST_HT_DCPERIOD;
        break;
      case TA_AD_TEST:
        unstId = TA_FUNC_UNST_HT_DCPHASE;
        integerTolerance = 0x168;
        goto LAB_0011450d;
      case TA_ADOSC_3_10_TEST:
        unstId = TA_FUNC_UNST_HT_TRENDLINE;
        break;
      case TA_ADOSC_5_2_TEST:
        unstId = TA_FUNC_UNST_HT_TRENDMODE;
        break;
      default:
        unstId = TA_FUNC_UNST_NONE;
      }
      integerTolerance = 0;
LAB_0011450d:
      EVar6 = doRangeTest(rangeTestFunction,unstId,&local_60,1,integerTolerance);
      if (EVar6 != TA_TEST_PASS) {
LAB_00114563:
        printf("Failed Test #%d (Code=%d)\n",local_50,(ulong)EVar6);
        return EVar6;
      }
    }
    uVar12 = local_50 + 1;
  } while( true );
}

Assistant:

ErrorNumber test_func_1in_1out( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}